

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O1

int64_t PredictionCostBias(uint32_t *counts,uint64_t weight_0,uint64_t exp_val)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint32_t *puVar5;
  long lVar6;
  
  lVar4 = *counts * weight_0 * 0x800000;
  lVar3 = exp_val << 0x17;
  puVar5 = counts + 0xff;
  lVar6 = 1;
  do {
    lVar1 = (ulong)(*puVar5 + counts[lVar6]) * lVar3;
    lVar2 = lVar1 + 0x32;
    if (lVar1 < 0) {
      lVar2 = lVar1 + -0x32;
    }
    lVar4 = lVar4 + lVar2 / 100;
    lVar2 = lVar3 * 6 + 5;
    if (lVar3 * 6 < 0) {
      lVar2 = lVar3 * 6 + -5;
    }
    lVar3 = lVar2 / 10;
    lVar6 = lVar6 + 1;
    puVar5 = puVar5 + -1;
  } while (lVar6 != 0x10);
  lVar3 = lVar4 + 5;
  if (lVar4 < 0) {
    lVar3 = lVar4 + -5;
  }
  lVar3 = SUB168(SEXT816(lVar3) * SEXT816(-0x6666666666666667),8);
  return (lVar3 >> 2) - (lVar3 >> 0x3f);
}

Assistant:

static int64_t PredictionCostBias(const uint32_t counts[256], uint64_t weight_0,
                                  uint64_t exp_val) {
  const int significant_symbols = 256 >> 4;
  const uint64_t exp_decay_factor = 6;  // has a scaling factor of 1/10
  uint64_t bits = (weight_0 * counts[0]) << LOG_2_PRECISION_BITS;
  int i;
  exp_val <<= LOG_2_PRECISION_BITS;
  for (i = 1; i < significant_symbols; ++i) {
    bits += DivRound(exp_val * (counts[i] + counts[256 - i]), 100);
    exp_val = DivRound(exp_decay_factor * exp_val, 10);
  }
  return -DivRound((int64_t)bits, 10);
}